

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

void __thiscall libtorrent::settings_pack::set_str(settings_pack *this,int name,string *val)

{
  __normal_iterator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __position;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  undefined1 local_68 [40];
  undefined1 local_40 [40];
  
  local_40._0_2_ = (undefined2)name;
  if ((name & 0xc000U) == 0) {
    ::std::__cxx11::string::string((string *)(local_40 + 8),(string *)val);
    ::std::
    pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_68,
           (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_40);
    __position = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_short,std::__cxx11::string>*,std::vector<std::pair<unsigned_short,std::__cxx11::string>,std::allocator<std::pair<unsigned_short,std::__cxx11::string>>>>,std::pair<unsigned_short,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<unsigned_short,std::__cxx11::string>const&,std::pair<unsigned_short,std::__cxx11::string>const&)>>
                           ((this->m_strings).
                            super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->m_strings).
                            super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            (pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_68,
                            (_Iter_comp_val<bool_(*)(const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                             )0x2bf1b1);
    if ((__position._M_current ==
         (this->m_strings).
         super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       ((__position._M_current)->first != local_68._0_2_)) {
      ::std::
      vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_insert_rval(&this->m_strings,(const_iterator)__position._M_current,(value_type *)local_68
                      );
    }
    else {
      ::std::__cxx11::string::operator=
                ((string *)&(__position._M_current)->second,(string *)(local_68 + 8));
    }
    ::std::__cxx11::string::~string((string *)(local_68 + 8));
    ::std::__cxx11::string::~string((string *)(local_40 + 8));
  }
  return;
}

Assistant:

void settings_pack::set_str(int const name, std::string val)
	{
		TORRENT_ASSERT((name & type_mask) == string_type_base);
		if ((name & type_mask) != string_type_base) return;
		std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::move(val));
		insort_replace(m_strings, std::move(v));
	}